

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_mem_no_alloc
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_bool mVar1;
  uint uVar2;
  size_t sVar3;
  mz_ulong mVar4;
  size_t local_2e28;
  size_t local_2e20;
  bool local_2e11;
  ulong local_2e10;
  size_t local_2e08;
  size_t out_buf_size;
  size_t in_buf_size;
  tinfl_decompressor inflator;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  void *local_2d0;
  void *pRead_buf;
  mz_zip_archive_file_stat file_stat;
  mz_uint64 read_buf_avail;
  mz_uint64 read_buf_ofs;
  mz_uint64 read_buf_size;
  mz_uint64 out_buf_ofs;
  mz_uint64 comp_remaining;
  mz_uint64 cur_file_ofs;
  mz_uint64 needed_size;
  int status;
  void *pUser_read_buf_local;
  mz_uint flags_local;
  size_t buf_size_local;
  void *pBuf_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  read_buf_size = 0;
  read_buf_avail = 0;
  inflator._10992_8_ = &pLocal_header;
  if ((buf_size == 0) || (pBuf != (void *)0x0)) {
    mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)&pRead_buf);
    if (mVar1 == 0) {
      pZip_local._4_4_ = 0;
    }
    else if (file_stat._24_8_ == 0) {
      pZip_local._4_4_ = 1;
    }
    else {
      mVar1 = mz_zip_reader_is_file_a_directory(pZip,file_index);
      if (mVar1 == 0) {
        if (((ushort)file_stat.m_central_dir_ofs & 0x21) == 0) {
          if ((((flags & 0x400) == 0) && (file_stat.m_central_dir_ofs._2_2_ != 0)) &&
             (file_stat.m_central_dir_ofs._2_2_ != 8)) {
            pZip_local._4_4_ = 0;
          }
          else {
            if ((flags & 0x400) == 0) {
              local_2e10 = file_stat.m_comp_size;
            }
            else {
              local_2e10 = file_stat._24_8_;
            }
            if (buf_size < local_2e10) {
              pZip_local._4_4_ = 0;
            }
            else {
              sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat._48_8_,
                                       (void *)inflator._10992_8_,0x1e);
              if (sVar3 == 0x1e) {
                if (*(int *)inflator._10992_8_ == 0x4034b50) {
                  comp_remaining =
                       (ulong)(*(ushort *)(inflator._10992_8_ + 0x1a) + 0x1e +
                              (uint)*(ushort *)(inflator._10992_8_ + 0x1c)) + file_stat._48_8_;
                  if (pZip->m_archive_size < comp_remaining + file_stat._24_8_) {
                    pZip_local._4_4_ = 0;
                  }
                  else if (((flags & 0x400) == 0) && (file_stat.m_central_dir_ofs._2_2_ != 0)) {
                    in_buf_size._0_4_ = 0;
                    if (pZip->m_pState->m_pMem == (void *)0x0) {
                      if (pUser_read_buf == (void *)0x0) {
                        if ((ulong)file_stat._24_8_ < 0x10000) {
                          local_2e20 = file_stat._24_8_;
                        }
                        else {
                          local_2e20 = 0x10000;
                        }
                        read_buf_ofs = local_2e20;
                        local_2d0 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2e20);
                        if (local_2d0 == (void *)0x0) {
                          return 0;
                        }
                        out_buf_ofs = file_stat._24_8_;
                      }
                      else {
                        if (user_read_buf_size == 0) {
                          return 0;
                        }
                        read_buf_ofs = user_read_buf_size;
                        out_buf_ofs = file_stat._24_8_;
                        local_2d0 = pUser_read_buf;
                      }
                      file_stat.m_comment[0xf8] = '\0';
                      file_stat.m_comment[0xf9] = '\0';
                      file_stat.m_comment[0xfa] = '\0';
                      file_stat.m_comment[0xfb] = '\0';
                      file_stat.m_comment[0xfc] = '\0';
                      file_stat.m_comment[0xfd] = '\0';
                      file_stat.m_comment[0xfe] = '\0';
                      file_stat.m_comment[0xff] = '\0';
                    }
                    else {
                      local_2d0 = (void *)((long)pZip->m_pState->m_pMem + comp_remaining);
                      file_stat.m_comment._248_8_ = file_stat._24_8_;
                      read_buf_ofs = file_stat._24_8_;
                      out_buf_ofs = 0;
                    }
                    do {
                      local_2e08 = file_stat.m_comp_size - read_buf_size;
                      if ((file_stat.m_comment._248_8_ == 0) &&
                         (pZip->m_pState->m_pMem == (void *)0x0)) {
                        if (read_buf_ofs < out_buf_ofs) {
                          local_2e28 = read_buf_ofs;
                        }
                        else {
                          local_2e28 = out_buf_ofs;
                        }
                        file_stat.m_comment[0xf8] = (undefined1)local_2e28;
                        file_stat.m_comment[0xf9] = local_2e28._1_1_;
                        file_stat.m_comment[0xfa] = local_2e28._2_1_;
                        file_stat.m_comment[0xfb] = local_2e28._3_1_;
                        file_stat.m_comment[0xfc] = local_2e28._4_1_;
                        file_stat.m_comment[0xfd] = local_2e28._5_1_;
                        file_stat.m_comment[0xfe] = local_2e28._6_1_;
                        file_stat.m_comment[0xff] = local_2e28._7_1_;
                        sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,comp_remaining,local_2d0,
                                                 local_2e28);
                        if (sVar3 != file_stat.m_comment._248_8_) {
                          needed_size._4_4_ = TINFL_STATUS_FAILED;
                          break;
                        }
                        comp_remaining = file_stat.m_comment._248_8_ + comp_remaining;
                        out_buf_ofs = out_buf_ofs - file_stat.m_comment._248_8_;
                        read_buf_avail = 0;
                      }
                      out_buf_size._0_1_ = file_stat.m_comment[0xf8];
                      out_buf_size._1_1_ = file_stat.m_comment[0xf9];
                      out_buf_size._2_1_ = file_stat.m_comment[0xfa];
                      out_buf_size._3_1_ = file_stat.m_comment[0xfb];
                      out_buf_size._4_1_ = file_stat.m_comment[0xfc];
                      out_buf_size._5_1_ = file_stat.m_comment[0xfd];
                      out_buf_size._6_1_ = file_stat.m_comment[0xfe];
                      out_buf_size._7_1_ = file_stat.m_comment[0xff];
                      uVar2 = 0;
                      if (out_buf_ofs != 0) {
                        uVar2 = 2;
                      }
                      needed_size._4_4_ =
                           tinfl_decompress((tinfl_decompressor *)&in_buf_size,
                                            (mz_uint8 *)((long)local_2d0 + read_buf_avail),
                                            &out_buf_size,(mz_uint8 *)pBuf,
                                            (mz_uint8 *)((long)pBuf + read_buf_size),&local_2e08,
                                            uVar2 | 4);
                      file_stat.m_comment._248_8_ = file_stat.m_comment._248_8_ - out_buf_size;
                      read_buf_avail = out_buf_size + read_buf_avail;
                      read_buf_size = local_2e08 + read_buf_size;
                    } while (needed_size._4_4_ == TINFL_STATUS_NEEDS_MORE_INPUT);
                    if ((needed_size._4_4_ == TINFL_STATUS_DONE) &&
                       ((read_buf_size != file_stat.m_comp_size ||
                        (mVar4 = mz_crc32(0,(mz_uint8 *)pBuf,file_stat.m_comp_size),
                        mVar4 != (uint)file_stat.m_time)))) {
                      needed_size._4_4_ = TINFL_STATUS_FAILED;
                    }
                    if ((pZip->m_pState->m_pMem == (void *)0x0) && (pUser_read_buf == (void *)0x0))
                    {
                      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_2d0);
                    }
                    pZip_local._4_4_ = (uint)(needed_size._4_4_ == TINFL_STATUS_DONE);
                  }
                  else {
                    sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,comp_remaining,pBuf,local_2e10);
                    if (sVar3 == local_2e10) {
                      local_2e11 = true;
                      if ((flags & 0x400) == 0) {
                        mVar4 = mz_crc32(0,(mz_uint8 *)pBuf,file_stat.m_comp_size);
                        local_2e11 = mVar4 == (uint)file_stat.m_time;
                      }
                      pZip_local._4_4_ = (uint)local_2e11;
                    }
                    else {
                      pZip_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  pZip_local._4_4_ = 0;
                }
              }
              else {
                pZip_local._4_4_ = 0;
              }
            }
          }
        }
        else {
          pZip_local._4_4_ = 0;
        }
      }
      else {
        pZip_local._4_4_ = 1;
      }
    }
  }
  else {
    pZip_local._4_4_ = 0;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_reader_extract_to_mem_no_alloc(mz_zip_archive *pZip,
                                              mz_uint file_index, void *pBuf,
                                              size_t buf_size, mz_uint flags,
                                              void *pUser_read_buf,
                                              size_t user_read_buf_size) {
  int status = TINFL_STATUS_DONE;
  mz_uint64 needed_size, cur_file_ofs, comp_remaining,
      out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  tinfl_decompressor inflator;

  if ((buf_size) && (!pBuf))
    return MZ_FALSE;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers). I'm torn how to handle this
  // case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Ensure supplied output buffer is large enough.
  needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                      : file_stat.m_uncomp_size;
  if (buf_size < needed_size)
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                      (size_t)needed_size) != needed_size)
      return MZ_FALSE;
    return ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) != 0) ||
           (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                     (size_t)file_stat.m_uncomp_size) == file_stat.m_crc32);
  }

  // Decompress the file either directly from memory or from a file input
  // buffer.
  tinfl_init(&inflator);

  if (pZip->m_pState->m_pMem) {
    // Read directly from the archive in memory.
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else if (pUser_read_buf) {
    // Use a user provided read buffer.
    if (!user_read_buf_size)
      return MZ_FALSE;
    pRead_buf = (mz_uint8 *)pUser_read_buf;
    read_buf_size = user_read_buf_size;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  } else {
    // Temporarily allocate a read buffer.
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
#ifdef _MSC_VER
    if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
        (read_buf_size > 0x7FFFFFFF))
#else
    if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
#endif
      return MZ_FALSE;
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  do {
    size_t in_buf_size,
        out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
    if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
      read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
      if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                        (size_t)read_buf_avail) != read_buf_avail) {
        status = TINFL_STATUS_FAILED;
        break;
      }
      cur_file_ofs += read_buf_avail;
      comp_remaining -= read_buf_avail;
      read_buf_ofs = 0;
    }
    in_buf_size = (size_t)read_buf_avail;
    status = tinfl_decompress(
        &inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
        (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size,
        TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF |
            (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
    read_buf_avail -= in_buf_size;
    read_buf_ofs += in_buf_size;
    out_buf_ofs += out_buf_size;
  } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

  if (status == TINFL_STATUS_DONE) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                  (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  return status == TINFL_STATUS_DONE;
}